

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void com_get_nbr_l(pel *dst,int ipm,int ipf,int x,int y,int width,int height,pel *srcT,pel *srcL,
                  int s_src,u16 avail_cu,int scup,com_scu_t *map_scu,int i_scu,int bit_depth)

{
  pel *ppVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  pel *ppVar5;
  pel *ppVar6;
  int local_c8;
  pel *ppStack_c0;
  int pads;
  pel *src;
  com_scu_t *map_left_scu;
  com_scu_t *map_up_scu;
  int pad_range;
  int default_val;
  int pad_up_in_scu;
  int pad_le_in_scu;
  pel *up;
  pel *left;
  pel *srcTL;
  int height_in_scu;
  int width_in_scu;
  int i;
  int width_local;
  int y_local;
  int x_local;
  int ipf_local;
  int ipm_local;
  pel *dst_local;
  
  ppVar1 = srcT;
  ppVar5 = srcT + -1;
  up = dst + -1;
  _pad_up_in_scu = dst + 1;
  iVar3 = 1 << ((char)bit_depth - 1U & 0x1f);
  local_c8 = width;
  if (width <= height) {
    local_c8 = height;
  }
  iVar4 = local_c8 * 2 + 4;
  sVar2 = (short)iVar3;
  if ((ipm < 0x18) || (ipf != 0)) {
    if ((avail_cu & 1) == 0) {
      memset(_pad_up_in_scu,(int)sVar2 & 0xff,(long)iVar4);
    }
    else {
      memcpy(_pad_up_in_scu,srcT,(long)width);
      _pad_up_in_scu = _pad_up_in_scu + width;
      srcT = srcT + width;
      height_in_scu = 0;
      map_left_scu = map_scu + (long)(width >> 2) + ((long)scup - (long)i_scu);
      while ((height_in_scu < width >> 2 && (((byte)*map_left_scu & 1) != 0))) {
        *(undefined4 *)_pad_up_in_scu = *(undefined4 *)srcT;
        height_in_scu = height_in_scu + 1;
        _pad_up_in_scu = _pad_up_in_scu + 4;
        srcT = srcT + 4;
        map_left_scu = map_left_scu + 1;
      }
      memset(_pad_up_in_scu,(int)(short)(ushort)_pad_up_in_scu[-1],
             (long)(iVar4 - (width + height_in_scu * 4)));
    }
  }
  if (((ipm < 3) || (0xc < ipm)) || (ipf != 0)) {
    if ((avail_cu & 2) == 0) {
      memset(up + (1 - (long)iVar4),(int)sVar2 & 0xff,(long)iVar4);
    }
    else {
      src = (pel *)(map_scu + (long)((height >> 2) * i_scu) + (long)scup + -1);
      ppStack_c0 = srcL;
      for (height_in_scu = 0; height_in_scu < height; height_in_scu = height_in_scu + 4) {
        *up = *ppStack_c0;
        ppStack_c0 = ppStack_c0 + s_src;
        up[-1] = *ppStack_c0;
        ppStack_c0 = ppStack_c0 + s_src;
        ppVar6 = up + -3;
        up[-2] = *ppStack_c0;
        up = up + -4;
        *ppVar6 = ppStack_c0[s_src];
        ppStack_c0 = ppStack_c0 + s_src + s_src;
      }
      height_in_scu = 0;
      for (; (height_in_scu < height >> 2 && ((*src & 1) != 0)); src = src + i_scu) {
        *up = *ppStack_c0;
        ppStack_c0 = ppStack_c0 + s_src;
        up[-1] = *ppStack_c0;
        ppStack_c0 = ppStack_c0 + s_src;
        ppVar6 = up + -3;
        up[-2] = *ppStack_c0;
        up = up + -4;
        *ppVar6 = ppStack_c0[s_src];
        ppStack_c0 = ppStack_c0 + s_src + s_src;
        height_in_scu = height_in_scu + 1;
      }
      iVar4 = (iVar4 - height) + height_in_scu * -4;
      memset(up + (1 - (long)iVar4),(int)(short)(ushort)up[1],(long)iVar4);
    }
  }
  if ((avail_cu & 4) == 0) {
    if ((avail_cu & 1) == 0) {
      if ((avail_cu & 2) == 0) {
        *dst = (pel)iVar3;
      }
      else {
        *dst = *srcL;
      }
    }
    else {
      *dst = *ppVar1;
    }
  }
  else {
    *dst = *ppVar5;
  }
  return;
}

Assistant:

void com_get_nbr_l(pel *dst, int ipm, int ipf, int x, int y, int width, int height, pel *srcT, pel *srcL, int s_src, u16 avail_cu, int scup, com_scu_t * map_scu, int i_scu, int bit_depth)
{
    int  i;
    int  width_in_scu = width >> MIN_CU_LOG2;
    int  height_in_scu = height >> MIN_CU_LOG2;
    pel *srcTL = srcT - 1;
    pel *left = dst - 1;
    pel *up = dst + 1;

    int pad_le_in_scu = height_in_scu;
    int pad_up_in_scu = width_in_scu;
    int default_val = 1 << (bit_depth - 1);
    int pad_range = COM_MAX(width, height) * 2 + 4;

    if (ipm < IPD_HOR || ipf) {
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            com_scu_t *map_up_scu = map_scu + scup - i_scu + width_in_scu;
         
            memcpy(up, srcT, width * sizeof(pel));
            up += width, srcT += width;

            for (i = 0; i < pad_up_in_scu; i++, up += MIN_CU_SIZE, srcT += MIN_CU_SIZE) {
                if ((map_up_scu++)->coded) {
                    com_mcpy_4pel(up, srcT);
                } else {
                    break;
                }
            }
            com_mset_pel(up, up[-1], pad_range - (width + i * MIN_CU_SIZE));
        } else {
            com_mset_pel(up, default_val, pad_range);
        }
    }
    if (ipm <= IPD_BI || ipm > IPD_VER || ipf) {
        if (IS_AVAIL(avail_cu, AVAIL_LE)) {
            com_scu_t *map_left_scu = map_scu + scup - 1 + height_in_scu * i_scu;
            pel *src = srcL;

            for (i = 0; i < height; i += 4) {
                *left-- = *src;
                src += s_src;
                *left-- = *src;
                src += s_src;
                *left-- = *src;
                src += s_src;
                *left-- = *src;
                src += s_src;
            }
            for (i = 0; i < pad_le_in_scu; i++, map_left_scu += i_scu) {
                if (map_left_scu->coded) {
                    *left-- = *src;
                    src += s_src;
                    *left-- = *src;
                    src += s_src;
                    *left-- = *src;
                    src += s_src;
                    *left-- = *src;
                    src += s_src;
                } else {
                    break;
                }
            }
            int pads = pad_range - height - i * MIN_CU_SIZE;
            com_mset_pel(left - pads + 1, left[1], pads);
        } else {
            com_mset_pel(left - pad_range + 1, default_val, pad_range);
        }
    }

    if (IS_AVAIL(avail_cu, AVAIL_UL)) {
        dst[0] = srcTL[0];
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        dst[0] = srcTL[1];
    } else if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        dst[0] = srcL[0];
    } else {
        dst[0] = default_val;
    }
}